

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

void PrintFinalStats(void *kmem,int linsolver)

{
  undefined4 uVar1;
  int in_ESI;
  undefined8 in_RDI;
  int flag;
  long nfeSG;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long nfe;
  long nni;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  undefined8 local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  uVar1 = KINGetNumNonlinSolvIters(in_RDI,&local_18);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumFuncEvals(local_8,&local_20);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumLinIters(local_8,&local_28);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumPrecEvals(local_8,&local_30);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumPrecSolves(local_8,&local_38);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumLinConvFails(local_8,&local_40);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  uVar1 = KINGetNumLinFuncEvals(local_8,&stack0xffffffffffffffb8);
  check_flag(in_stack_ffffffffffffffb8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n",local_18,local_28);
  printf("nfe    = %5ld    nfeSG = %5ld\n",local_20,in_stack_ffffffffffffffb8);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n",local_38,local_30,local_40);
  if (local_c < 3) {
    printf("\n=========================================================\n\n");
  }
  return;
}

Assistant:

static void PrintFinalStats(void* kmem, int linsolver)
{
  long int nni, nfe, nli, npe, nps, ncfl, nfeSG;
  int flag;

  flag = KINGetNumNonlinSolvIters(kmem, &nni);
  check_flag(&flag, "KINGetNumNonlinSolvIters", 1);
  flag = KINGetNumFuncEvals(kmem, &nfe);
  check_flag(&flag, "KINGetNumFuncEvals", 1);

  flag = KINGetNumLinIters(kmem, &nli);
  check_flag(&flag, "KINGetNumLinIters", 1);
  flag = KINGetNumPrecEvals(kmem, &npe);
  check_flag(&flag, "KINGetNumPrecEvals", 1);
  flag = KINGetNumPrecSolves(kmem, &nps);
  check_flag(&flag, "KINGetNumPrecSolves", 1);
  flag = KINGetNumLinConvFails(kmem, &ncfl);
  check_flag(&flag, "KINGetNumLinConvFails", 1);
  flag = KINGetNumLinFuncEvals(kmem, &nfeSG);
  check_flag(&flag, "KINGetNumLinFuncEvals", 1);

  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n", nni, nli);
  printf("nfe    = %5ld    nfeSG = %5ld\n", nfe, nfeSG);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n", nps, npe, ncfl);

  if (linsolver < 3)
  {
    printf("\n=========================================================\n\n");
  }
}